

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O0

string * __thiscall
cppjieba::PosTagger::LookupTag(PosTagger *this,string *str,SegmentTagged *segment)

{
  undefined1 uVar1;
  long lVar2;
  ostream *poVar3;
  RuneStrArray *unicode;
  ulong uVar4;
  long *in_RCX;
  string *in_RDI;
  DictTrie *dict;
  RuneStrArray runes;
  DictUnit *tmp;
  RuneStrArray *in_stack_fffffffffffffc78;
  allocator *paVar5;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffc80;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffc90;
  PosTagger *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  allocator local_321;
  undefined4 local_320;
  allocator local_319 [37];
  int in_stack_fffffffffffffd0c;
  char *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  Logger *in_stack_fffffffffffffd20;
  LocalVector<cppjieba::RuneStr> local_180;
  RuneStrArray *local_28;
  long *local_20;
  
  local_28 = (RuneStrArray *)0x0;
  local_20 = in_RCX;
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector(in_stack_fffffffffffffc90);
  lVar2 = (**(code **)(*local_20 + 0x20))();
  if (lVar2 == 0) {
    __assert_fail("dict != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/PosTagger.hpp"
                  ,0x24,
                  "string cppjieba::PosTagger::LookupTag(const string &, const SegmentTagged &) const"
                 );
  }
  uVar1 = DecodeRunesInString((string *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  if ((bool)uVar1) {
    limonp::LocalVector<cppjieba::RuneStr>::begin(&local_180);
    limonp::LocalVector<cppjieba::RuneStr>::end(&local_180);
    unicode = (RuneStrArray *)
              DictTrie::Find((DictTrie *)in_stack_fffffffffffffc80,
                             in_stack_fffffffffffffc78->buffer_,(const_iterator)0x155193);
    local_28 = unicode;
    if (unicode != (RuneStrArray *)0x0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::string
                  (in_RDI,(string *)((long)((Unicode *)local_28->buffer_ + 1) + 8));
        goto LAB_00155259;
      }
    }
    in_stack_fffffffffffffc80 =
         (LocalVector<cppjieba::RuneStr> *)SpecialRule(in_stack_fffffffffffffca8,unicode);
    paVar5 = &local_321;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,(char *)in_stack_fffffffffffffc80,paVar5);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
  }
  else {
    limonp::Logger::Logger
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd0c);
    poVar3 = limonp::Logger::Stream((Logger *)(local_319 + 1));
    std::operator<<(poVar3,"Decode failed.");
    limonp::Logger::~Logger((Logger *)CONCAT17(uVar1,in_stack_fffffffffffffcb0));
    paVar5 = local_319;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"x",paVar5);
    std::allocator<char>::~allocator((allocator<char> *)local_319);
  }
LAB_00155259:
  local_320 = 1;
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(in_stack_fffffffffffffc80);
  return in_RDI;
}

Assistant:

string LookupTag(const string &str, const SegmentTagged& segment) const {
    const DictUnit *tmp = NULL;
    RuneStrArray runes;
    const DictTrie * dict = segment.GetDictTrie();
    assert(dict != NULL);
      if (!DecodeRunesInString(str, runes)) {
        XLOG(ERROR) << "Decode failed.";
        return POS_X;
      }
      tmp = dict->Find(runes.begin(), runes.end());
      if (tmp == NULL || tmp->tag.empty()) {
        return SpecialRule(runes);
      } else {
        return tmp->tag;
      }
  }